

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O0

int Skein_512_Final(Skein_512_Ctxt_t *ctx,u08b_t *hashVal)

{
  ulong uVar1;
  undefined1 local_78 [8];
  u64b_t X [8];
  size_t byteCnt;
  size_t n;
  size_t i;
  u08b_t *hashVal_local;
  Skein_512_Ctxt_t *ctx_local;
  
  (ctx->h).T[1] = (ctx->h).T[1] | 0x8000000000000000;
  if ((ctx->h).bCnt < 0x40) {
    memset(ctx->b + (ctx->h).bCnt,0,0x40 - (ctx->h).bCnt);
  }
  Skein_512_Process_Block(ctx,ctx->b,1,(ctx->h).bCnt);
  uVar1 = (ctx->h).hashBitLen + 7 >> 3;
  memset(ctx->b,0,0x40);
  memcpy(local_78,ctx->X,0x40);
  for (n = 0; n << 6 < uVar1; n = n + 1) {
    *(size_t *)ctx->b = n;
    (ctx->h).T[0] = 0;
    (ctx->h).T[1] = 0xff00000000000000;
    (ctx->h).bCnt = 0;
    Skein_512_Process_Block(ctx,ctx->b,1,8);
    byteCnt = uVar1 + n * -0x40;
    if (0x3f < byteCnt) {
      byteCnt = 0x40;
    }
    memcpy(hashVal + n * 0x40,ctx->X,byteCnt);
    memcpy(ctx->X,local_78,0x40);
  }
  return 0;
}

Assistant:

int Skein_512_Final(Skein_512_Ctxt_t *ctx, u08b_t *hashVal)
{
    size_t i,n,byteCnt;
    u64b_t X[SKEIN_512_STATE_WORDS];
    Skein_Assert(ctx->h.bCnt <= SKEIN_512_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;                 /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_512_BLOCK_BYTES)            /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_512_BLOCK_BYTES - ctx->h.bCnt);

    Skein_512_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);  /* process the final block */

    /* now output the result */
    byteCnt = (ctx->h.hashBitLen + 7) >> 3;             /* total number of output bytes */

    /* run Threefish in "counter mode" to generate output */
    memset(ctx->b,0,sizeof(ctx->b));  /* zero out b[], so it can hold the counter */
    memcpy(X,ctx->X,sizeof(X));       /* keep a local copy of counter mode "key" */
    for (i=0;i*SKEIN_512_BLOCK_BYTES < byteCnt;i++)
    {
        ((u64b_t *)ctx->b)[0]= Skein_Swap64((u64b_t) i); /* build the counter block */
        Skein_Start_New_Type(ctx,OUT_FINAL);
        Skein_512_Process_Block(ctx,ctx->b,1,sizeof(u64b_t)); /* run "counter mode" */
        n = byteCnt - i*SKEIN_512_BLOCK_BYTES;   /* number of output bytes left to go */
        if (n >= SKEIN_512_BLOCK_BYTES)
            n  = SKEIN_512_BLOCK_BYTES;
        Skein_Put64_LSB_First(hashVal+i*SKEIN_512_BLOCK_BYTES,ctx->X,n);   /* "output" the ctr mode bytes */
        Skein_Show_Final(512,&ctx->h,n,hashVal+i*SKEIN_512_BLOCK_BYTES);
        memcpy(ctx->X,X,sizeof(X));   /* restore the counter mode key for next time */
    }
    return SKEIN_SUCCESS;
}